

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdCelsiusCullFace::emulate_mthd(MthdCelsiusCullFace *this)

{
  pgraph_state *state;
  uint32_t uVar1;
  uint uVar2;
  uint32_t err;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  err = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4;
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (uVar1 == 0x404) {
    uVar2 = 0x200000;
  }
  else if (uVar1 == 0x408) {
    uVar2 = 0x600000;
  }
  else {
    if (uVar1 != 0x405) {
      err = err | 1;
      goto LAB_0020bcb6;
    }
    uVar2 = 0x400000;
  }
  if (err == 0) {
    if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
      uVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster &
              0xff9fffff | uVar2;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster = uVar2;
      pgraph_celsius_icmd(state,0x22,uVar2,true);
      return;
    }
    return;
  }
LAB_0020bcb6:
  MthdTest::warn((MthdTest *)this,err);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		uint32_t rv = 0;
		switch (val) {
			case 0x404:
				rv = 1;
				break;
			case 0x405:
				rv = 2;
				break;
			case 0x408:
				rv = 3;
				break;
			default:
				err |= 1;
		}
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_raster, 21, 2, rv);
				pgraph_celsius_icmd(&exp, 0x22, exp.bundle_raster, true);
			}
		}
	}